

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O3

Var Js::JavascriptFunction::NewInstanceHelper
              (ScriptContext *scriptContext,RecyclableObject *function,CallInfo callInfo,
              ArgumentReader *args,FunctionKind functionKind)

{
  JavascriptLibrary *pJVar1;
  Type TVar2;
  FunctionProxy *proxy;
  code *pcVar3;
  StringCache *this;
  bool bVar4;
  int iVar5;
  charcount_t cVar6;
  uint32 uVar7;
  undefined4 *puVar8;
  Var aValue;
  JavascriptString *pJVar9;
  JavascriptString *pJVar10;
  JavascriptString *pJVar11;
  JavascriptString *pJVar12;
  undefined4 extraout_var;
  GeneratorVirtualScriptFunction *scriptFunction;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ParseableFunctionInfo *pPVar13;
  FunctionBody *body;
  TopLevelNewFunctionBodyResolveInfo *pTVar14;
  GeneratorVirtualScriptFunction *pGVar15;
  RecyclableObject *constructor;
  uint sourceLength;
  uint uVar16;
  ulong uVar17;
  undefined1 isAsync;
  Type *this_00;
  undefined1 local_b8 [8];
  EvalMapString key;
  FunctionInfo *local_68;
  FunctionInfo *pfuncInfoCache;
  undefined8 uStack_58;
  ulong local_50;
  undefined8 local_48;
  StringCache *local_40;
  charcount_t local_38;
  char local_32;
  byte local_31;
  
  pJVar1 = (((function->type).ptr)->javascriptLibrary).ptr;
  TVar2 = (args->super_Arguments).Info;
  uVar16 = TVar2._0_4_;
  if (((ulong)TVar2 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0x85,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar4) goto LAB_00bc50ad;
    *puVar8 = 0;
    uVar16 = SUB84((args->super_Arguments).Info,0);
  }
  local_31 = (functionKind - Generator & 0xfffffffd) == 0;
  local_50 = (ulong)functionKind;
  aValue = CallInfo::GetNewTarget(uVar16 >> 0x18,(args->super_Arguments).Values,uVar16 & 0xffffff);
  key._32_8_ = (args->super_Arguments).Info;
  local_32 = JavascriptOperators::GetAndAssertIsConstructorSuperCall((Arguments *)&key.strict);
  this_00 = &pJVar1->stringCache;
  local_48 = StringCache::GetCommaDisplay(this_00);
  local_40 = this_00;
  pJVar9 = StringCache::GetOpenRBracket(this_00);
  if ((*(uint *)&(args->super_Arguments).Info & 0xffffff) - 3 < 0xfffffffe) {
    uVar17 = 1;
    do {
      if (uVar17 != 1) {
        pJVar9 = JavascriptString::Concat(pJVar9,local_48);
      }
      pJVar10 = JavascriptConversion::ToString((args->super_Arguments).Values[uVar17],scriptContext)
      ;
      pJVar9 = JavascriptString::Concat(pJVar9,pJVar10);
      uVar17 = uVar17 + 1;
    } while (uVar17 < (*(uint *)&(args->super_Arguments).Info & 0xffffff) - 1);
  }
  this = local_40;
  pJVar10 = StringCache::GetNewLineCloseRBracket(local_40);
  pJVar9 = JavascriptString::Concat(pJVar9,pJVar10);
  TVar2 = (args->super_Arguments).Info;
  if (((ulong)TVar2 & 0xfffffe) == 0) {
    pJVar10 = (JavascriptString *)0x0;
  }
  else {
    pJVar10 = JavascriptConversion::ToString
                        ((args->super_Arguments).Values[(ulong)(TVar2._0_4_ & 0xffffff) - 1],
                         scriptContext);
  }
  uVar16 = (uint)local_50;
  if (uVar16 == 2) {
    pJVar11 = StringCache::GetAsyncFunctionAnonymous(this);
  }
  else if (uVar16 == 1) {
    pJVar11 = StringCache::GetFunctionPTRAnonymous(this);
  }
  else if (uVar16 == 3) {
    pJVar11 = StringCache::GetAsyncGeneratorAnonymous(this);
  }
  else {
    pJVar11 = StringCache::GetFunctionAnonymous(this);
  }
  pJVar11 = JavascriptString::Concat(pJVar11,pJVar9);
  pJVar12 = StringCache::GetSpaceOpenBracket(this);
  pJVar11 = JavascriptString::Concat(pJVar11,pJVar12);
  if (pJVar10 != (JavascriptString *)0x0) {
    pJVar11 = JavascriptString::Concat(pJVar11,pJVar10);
  }
  pJVar12 = StringCache::GetNewLineCloseBracket(this);
  pJVar11 = JavascriptString::Concat(pJVar11,pJVar12);
  local_68 = (FunctionInfo *)0x0;
  iVar5 = (*(pJVar11->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pJVar11);
  local_38 = JavascriptString::GetLength(pJVar11);
  isAsync = 0;
  local_40 = (StringCache *)CONCAT44(extraout_var,iVar5);
  EvalMapStringInternal<false>::EvalMapStringInternal
            ((EvalMapStringInternal<false> *)local_b8,(FinalizableObject *)pJVar11,
             (char16 *)CONCAT44(extraout_var,iVar5),local_38,0,0,0);
  bVar4 = ScriptContext::IsInNewFunctionMap
                    (scriptContext,(EvalMapStringInternal<false> *)local_b8,&local_68);
  local_48 = (JavascriptString *)(CONCAT44(local_48._4_4_,uVar16) & 0xfffffffffffffffe);
  if (bVar4) {
    pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    proxy = (local_68->functionBodyImpl).ptr;
    if ((local_68->attributes & (Async|Generator)) == None) {
      scriptFunction =
           (GeneratorVirtualScriptFunction *)JavascriptLibrary::CreateScriptFunction(pJVar1,proxy);
    }
    else {
      scriptFunction = JavascriptLibrary::CreateGeneratorVirtualScriptFunction(pJVar1,proxy);
    }
  }
  else {
    iVar5 = (*(pJVar9->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x65])(pJVar9);
    cVar6 = JavascriptString::GetLength(pJVar9);
    pfuncInfoCache = (FunctionInfo *)Parser::ValidateFormals;
    uStack_58 = 0;
    sourceLength = (uint)local_31;
    GlobalObject::ValidateSyntax
              ((GlobalObject *)scriptContext,(ScriptContext *)CONCAT44(extraout_var_00,iVar5),
               (char16 *)(ulong)cVar6,sourceLength,(uVar16 & 0xfffffffe) == 2,(bool)isAsync,0xe6e496
              );
    if (pJVar10 != (JavascriptString *)0x0) {
      bVar4 = (int)local_48 == 2;
      iVar5 = (*(pJVar10->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar10);
      cVar6 = JavascriptString::GetLength(pJVar10);
      pfuncInfoCache = (FunctionInfo *)Parser::ValidateSourceElementList;
      uStack_58 = 0;
      GlobalObject::ValidateSyntax
                ((GlobalObject *)scriptContext,(ScriptContext *)CONCAT44(extraout_var_01,iVar5),
                 (char16 *)(ulong)cVar6,sourceLength,bVar4,(bool)isAsync,0xe6e4cc);
    }
    scriptFunction =
         (GeneratorVirtualScriptFunction *)
         (*((scriptContext->super_ScriptContextBase).globalObject)->EvalHelper)
                   (scriptContext,(char16_t *)local_40,local_38,0,0x10,L"Function code",1,1,0);
    pPVar13 = GetParseableFunctionInfo((JavascriptFunction *)scriptFunction);
    if (pPVar13 == (ParseableFunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                  ,0xdc,"(functionInfo)","functionInfo");
      if (!bVar4) goto LAB_00bc50ad;
      *puVar8 = 0;
    }
    uVar7 = ParseableFunctionInfo::GetGrfscr(pPVar13);
    ParseableFunctionInfo::SetGrfscr(pPVar13,uVar7 | 0x1000);
    if (scriptContext->TTDRecordOrReplayModeEnabled == false) {
      ScriptContext::AddToNewFunctionMap
                (scriptContext,(EvalMapString *)local_b8,
                 (pPVar13->super_FunctionProxy).functionInfo.ptr);
    }
  }
  if ((scriptFunction != (GeneratorVirtualScriptFunction *)0x0) &&
     ((scriptContext->TTDRecordModeEnabled != false ||
      (scriptContext->TTDShouldPerformReplayAction == true)))) {
    pPVar13 = GetParseableFunctionInfo((JavascriptFunction *)scriptFunction);
    body = TTD::JsSupport::ForceAndGetFunctionBody(pPVar13);
    bVar4 = TTD::ScriptContextTTD::IsBodyAlreadyLoadedAtTopLevel(scriptContext->TTDContextInfo,body)
    ;
    if (!bVar4) {
      uVar7 = 0;
      if (scriptContext->TTDRecordModeEnabled == true) {
        pTVar14 = TTD::EventLog::AddNewFunction
                            (scriptContext->threadContext->TTDLog,body,0,(char16 *)local_40,local_38
                            );
        if (scriptContext->TTDShouldPerformRecordAction == true) {
          TTD::EventLog::RecordTopLevelCodeAction
                    (scriptContext->threadContext->TTDLog,(pTVar14->TopLevelBase).TopLevelBodyCtr);
        }
        uVar7 = (pTVar14->TopLevelBase).TopLevelBodyCtr;
      }
      if (scriptContext->TTDShouldPerformReplayAction == true) {
        uVar7 = TTD::EventLog::ReplayTopLevelCodeAction(scriptContext->threadContext->TTDLog);
      }
      TTD::ScriptContextTTD::ProcessFunctionBodyOnLoad
                (scriptContext->TTDContextInfo,body,(FunctionBody *)0x0);
      TTD::ScriptContextTTD::RegisterNewScript(scriptContext->TTDContextInfo,body,uVar7);
      if (scriptContext->TTDShouldPerformRecordOrReplayAction == true) {
        ((body->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
        m_sourceInfoId = uVar7;
      }
      if (scriptContext->TTDShouldPerformReplayDebuggerAction == true) {
        TTD::ExecutionInfoManager::ProcessScriptLoad
                  (scriptContext->threadContext->TTDExecutionInfo,scriptContext,uVar7,body,
                   (body->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr,
                   (CompileScriptException *)0x0);
      }
    }
  }
  uVar16 = (uint)local_50;
  if (((uVar16 | 2) == 3) || ((int)local_48 == 2)) {
    if ((((scriptFunction->super_ScriptFunction).super_ScriptFunctionBase.super_JavascriptFunction.
          functionInfo.ptr)->attributes & (Async|Generator)) == None) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                  ,0x124,"(pfuncScript->GetFunctionInfo()->IsCoroutine())",
                                  "pfuncScript->GetFunctionInfo()->IsCoroutine()");
      if (!bVar4) {
LAB_00bc50ad:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
    }
    pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    if (uVar16 == 2) {
      pGVar15 = (GeneratorVirtualScriptFunction *)
                JavascriptLibrary::CreateAsyncFunction
                          (pJVar1,JavascriptAsyncFunction::EntryAsyncFunctionImplementation,
                           scriptFunction);
    }
    else if (uVar16 == 3) {
      pGVar15 = (GeneratorVirtualScriptFunction *)
                JavascriptLibrary::CreateAsyncGeneratorFunction
                          (pJVar1,JavascriptAsyncGeneratorFunction::
                                  EntryAsyncGeneratorFunctionImplementation,scriptFunction);
    }
    else {
      pGVar15 = (GeneratorVirtualScriptFunction *)
                JavascriptLibrary::CreateGeneratorFunction
                          (pJVar1,JavascriptGeneratorFunction::EntryGeneratorFunctionImplementation,
                           scriptFunction);
    }
    Memory::Recycler::WBSetBit((char *)&scriptFunction->realFunction);
    (scriptFunction->realFunction).ptr = (JavascriptGeneratorFunction *)pGVar15;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&scriptFunction->realFunction);
    scriptFunction = pGVar15;
  }
  if (local_32 != '\0') {
    constructor = VarTo<Js::RecyclableObject>(aValue);
    scriptFunction =
         (GeneratorVirtualScriptFunction *)
         JavascriptOperators::OrdinaryCreateFromConstructor
                   (constructor,(RecyclableObject *)scriptFunction,(DynamicObject *)0x0,
                    scriptContext);
  }
  return scriptFunction;
}

Assistant:

Var JavascriptFunction::NewInstanceHelper(ScriptContext *scriptContext, RecyclableObject* function, CallInfo callInfo, Js::ArgumentReader& args, FunctionKind functionKind /* = FunctionKind::Normal */)
    {
        JavascriptLibrary* library = function->GetLibrary();

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        bool isAsync = functionKind == FunctionKind::Async || functionKind == FunctionKind::AsyncGenerator;
        bool isGenerator = functionKind == FunctionKind::Generator || functionKind == FunctionKind::AsyncGenerator;

        // SkipDefaultNewObject function flag should have prevented the default object from
        // being created, except when call true a host dispatch.
        Var newTarget = args.GetNewTarget();
        bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);

        JavascriptString* separator = library->GetCommaDisplayString();

        // Gather all the formals into a string like (fml1, fml2, fml3)
        JavascriptString *formals = library->GetOpenRBracketString();

        for (uint i = 1; i < args.Info.Count - 1; ++i)
        {
            if (i != 1)
            {
                formals = JavascriptString::Concat(formals, separator);
            }
            formals = JavascriptString::Concat(formals, JavascriptConversion::ToString(args.Values[i], scriptContext));
        }
        formals = JavascriptString::Concat(formals, library->GetNewLineCloseRBracketString());
        // Function body, last argument to Function(...)
        JavascriptString *fnBody = NULL;
        if (args.Info.Count > 1)
        {
            fnBody = JavascriptConversion::ToString(args.Values[args.Info.Count - 1], scriptContext);
        }

        // Create a string representing the anonymous function
        Assert(
            0 + // "function anonymous" GetFunctionAnonymousString
            0 + // "("   GetOpenRBracketString
            1 + // "\n)" GetNewLineCloseRBracketString
            0 // " {"  GetSpaceOpenBracketString
            == numberLinesPrependedToAnonymousFunction); // Be sure to add exactly one line to anonymous function

        JavascriptString *bs = functionKind == FunctionKind::Async ?
            library->GetAsyncFunctionAnonymousString() :
            functionKind == FunctionKind::Generator ?
            library->GetFunctionPTRAnonymousString() :
            functionKind == FunctionKind::AsyncGenerator ?
            library->GetAsyncGeneratorAnonymousString() :
            library->GetFunctionAnonymousString();

        bs = JavascriptString::Concat(bs, formals);
        bs = JavascriptString::Concat(bs, library->GetSpaceOpenBracketString());
        if (fnBody != NULL)
        {
            bs = JavascriptString::Concat(bs, fnBody);
        }

        bs = JavascriptString::Concat(bs, library->GetNewLineCloseBracketString());
        // Bug 1105479. Get the module id from the caller
        ModuleID moduleID = kmodGlobal;

        BOOL strictMode = FALSE;

        JavascriptFunction* pfuncScript;
        FunctionInfo *pfuncInfoCache = NULL;
        char16 const * sourceString = bs->GetSz();
        charcount_t sourceLen = bs->GetLength();
        EvalMapString key(bs, sourceString, sourceLen, moduleID, strictMode, /* isLibraryCode = */ false);
        if (!scriptContext->IsInNewFunctionMap(key, &pfuncInfoCache))
        {
            // Validate formals here
            scriptContext->GetGlobalObject()->ValidateSyntax(
                scriptContext, formals->GetSz(), formals->GetLength(),
                isGenerator, isAsync,
                &Parser::ValidateFormals);
            if (fnBody != NULL)
            {
                // Validate function body
                scriptContext->GetGlobalObject()->ValidateSyntax(
                    scriptContext, fnBody->GetSz(), fnBody->GetLength(),
                    isGenerator, isAsync,
                    &Parser::ValidateSourceElementList);
            }

            pfuncScript = scriptContext->GetGlobalObject()->EvalHelper(scriptContext, sourceString, sourceLen, moduleID, fscrCanDeferFncParse, Constants::FunctionCode, TRUE, TRUE, strictMode);

            // Indicate that this is a top-level function. We don't pass the fscrGlobalCode flag to the eval helper,
            // or it will return the global function that wraps the declared function body, as though it were an eval.
            // But we want, for instance, to be able to verify that we did the right amount of deferred parsing.
            ParseableFunctionInfo *functionInfo = pfuncScript->GetParseableFunctionInfo();
            Assert(functionInfo);
            functionInfo->SetGrfscr(functionInfo->GetGrfscr() | fscrGlobalCode);

#if ENABLE_TTD
            if(!scriptContext->IsTTDRecordOrReplayModeEnabled())
            {
                scriptContext->AddToNewFunctionMap(key, functionInfo->GetFunctionInfo());
            }
#else
            scriptContext->AddToNewFunctionMap(key, functionInfo->GetFunctionInfo());
#endif
        }
        else if (pfuncInfoCache->IsCoroutine())
        {
            pfuncScript = scriptContext->GetLibrary()->CreateGeneratorVirtualScriptFunction(pfuncInfoCache->GetFunctionProxy());
        }
        else
        {
            pfuncScript = scriptContext->GetLibrary()->CreateScriptFunction(pfuncInfoCache->GetFunctionProxy());
        }

#if ENABLE_TTD
        //
        //TODO: We may (probably?) want to use the debugger source rundown functionality here instead
        //
        if(pfuncScript != nullptr && (scriptContext->IsTTDRecordModeEnabled() || scriptContext->ShouldPerformReplayAction()))
        {
            //Make sure we have the body and text information available
            FunctionBody* globalBody = TTD::JsSupport::ForceAndGetFunctionBody(pfuncScript->GetParseableFunctionInfo());
            if(!scriptContext->TTDContextInfo->IsBodyAlreadyLoadedAtTopLevel(globalBody))
            {
                uint32 bodyIdCtr = 0;

                if(scriptContext->IsTTDRecordModeEnabled())
                {
                    const TTD::NSSnapValues::TopLevelNewFunctionBodyResolveInfo* tbfi = scriptContext->GetThreadContext()->TTDLog->AddNewFunction(globalBody, moduleID, sourceString, sourceLen);

                    //We always want to register the top-level load but we don't always need to log the event
                    if(scriptContext->ShouldPerformRecordAction())
                    {
                        scriptContext->GetThreadContext()->TTDLog->RecordTopLevelCodeAction(tbfi->TopLevelBase.TopLevelBodyCtr);
                    }

                    bodyIdCtr = tbfi->TopLevelBase.TopLevelBodyCtr;
                }

                if(scriptContext->ShouldPerformReplayAction())
                {
                    bodyIdCtr = scriptContext->GetThreadContext()->TTDLog->ReplayTopLevelCodeAction();
                }

                //walk global body to (1) add functions to pin set (2) build parent map
                scriptContext->TTDContextInfo->ProcessFunctionBodyOnLoad(globalBody, nullptr);
                scriptContext->TTDContextInfo->RegisterNewScript(globalBody, bodyIdCtr);

                if(scriptContext->ShouldPerformRecordOrReplayAction())
                {
                    globalBody->GetUtf8SourceInfo()->SetSourceInfoForDebugReplay_TTD(bodyIdCtr);
                }

                if(scriptContext->ShouldPerformReplayDebuggerAction())
                {
                    scriptContext->GetThreadContext()->TTDExecutionInfo->ProcessScriptLoad(scriptContext, bodyIdCtr, globalBody, globalBody->GetUtf8SourceInfo(), nullptr);
                }
            }
        }
#endif

        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_FUNCTION(pfuncScript, EtwTrace::GetFunctionId(pfuncScript->GetFunctionProxy())));

        if (isGenerator || isAsync)
        {
            Assert(pfuncScript->GetFunctionInfo()->IsCoroutine());
            auto pfuncVirt = static_cast<GeneratorVirtualScriptFunction*>(pfuncScript);
            auto pfuncGen = functionKind == FunctionKind::Async ?
                scriptContext->GetLibrary()->CreateAsyncFunction(JavascriptAsyncFunction::EntryAsyncFunctionImplementation, pfuncVirt) :
                functionKind == FunctionKind::AsyncGenerator ?
                scriptContext->GetLibrary()->CreateAsyncGeneratorFunction(JavascriptAsyncGeneratorFunction::EntryAsyncGeneratorFunctionImplementation, pfuncVirt) :
                scriptContext->GetLibrary()->CreateGeneratorFunction(JavascriptGeneratorFunction::EntryGeneratorFunctionImplementation, pfuncVirt);
            pfuncVirt->SetRealGeneratorFunction(pfuncGen);
            pfuncScript = pfuncGen;
        }

        return isCtorSuperCall ?
            JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), pfuncScript, nullptr, scriptContext) :
            pfuncScript;
    }